

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::InitializeKeyValue(MapFieldBase *this,MessageLite *msg)

{
  int iVar1;
  Message *pMVar2;
  undefined4 extraout_var;
  Arena *arena;
  
  pMVar2 = GetMapEntryValuePrototype
                     ((Message *)(this->super_MapFieldBaseForParse).prototype_as_void_);
  iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[4])(pMVar2);
  arena = MapFieldBase::arena(this);
  ClassData::PlacementNew((ClassData *)CONCAT44(extraout_var,iVar1),msg,arena);
  return;
}

Assistant:

void InitializeKeyValue(MessageLite* msg) {
    GetClassData(GetMapEntryValuePrototype(*GetPrototype()))
        ->PlacementNew(msg, arena());
  }